

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

SSTableHeader * SSTable::readHeader(SSTableHeader *__return_storage_ptr__,string *fileName)

{
  runtime_error *this;
  long *plVar1;
  long *plVar2;
  uint64_t maxKey;
  uint64_t minKey;
  uint64_t length;
  uint64_t timeStamp;
  ifstream in;
  uint64_t local_278;
  uint64_t local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248;
  long local_240;
  long local_238;
  long lStack_230;
  long local_228 [4];
  byte abStack_208 [488];
  
  std::ifstream::ifstream(local_228,(string *)fileName,_S_in|_S_bin);
  if ((abStack_208[*(long *)(local_228[0] + -0x18)] & 5) == 0) {
    std::istream::read((char *)local_228,(long)&local_248);
    std::istream::read((char *)local_228,(long)&local_268);
    std::istream::read((char *)local_228,(long)&local_270);
    std::istream::read((char *)local_228,(long)&local_278);
    std::ifstream::close();
    __return_storage_ptr__->timeStamp = (uint64_t)local_248;
    __return_storage_ptr__->length = (uint64_t)local_268._M_dataplus._M_p;
    __return_storage_ptr__->minKey = local_270;
    __return_storage_ptr__->maxKey = local_278;
    std::ifstream::~ifstream(local_228);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_268,"readHeader: Open file ",fileName);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_268);
  local_248 = (long *)*plVar1;
  plVar2 = plVar1 + 2;
  if (local_248 == plVar2) {
    local_238 = *plVar2;
    lStack_230 = plVar1[3];
    local_248 = &local_238;
  }
  else {
    local_238 = *plVar2;
  }
  local_240 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::runtime_error::runtime_error(this,(string *)&local_248);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

SSTableHeader SSTable::readHeader(const string &fileName) {
  ifstream in(fileName, ios_base::in | ios_base::binary);
  if (in.fail())
    throw runtime_error("readHeader: Open file " + fileName + " failed!");
  uint64_t timeStamp, length, minKey, maxKey;
  read64(in, timeStamp);
  read64(in, length);
  read64(in, minKey);
  read64(in, maxKey);
  in.close();
  return SSTableHeader(timeStamp, length, minKey, maxKey);
}